

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatClause.c
# Opt level: O0

void Msat_ClausePrint(Msat_Clause_t *pC)

{
  char *pcVar1;
  float fVar2;
  int local_14;
  int i;
  Msat_Clause_t *pC_local;
  
  if (pC == (Msat_Clause_t *)0x0) {
    printf("NULL pointer");
  }
  else {
    if ((*(uint *)&pC->field_0x4 & 1) != 0) {
      fVar2 = Msat_ClauseReadActivity(pC);
      printf("Act = %.4f  ",(double)fVar2);
    }
    for (local_14 = 0; local_14 < (int)(*(uint *)&pC->field_0x4 >> 3 & 0x3fff);
        local_14 = local_14 + 1) {
      pcVar1 = "";
      if (((&pC[1].Num)[local_14] & 1U) != 0) {
        pcVar1 = "-";
      }
      printf(" %s%d",pcVar1,(ulong)((&pC[1].Num)[local_14] / 2 + 1));
    }
  }
  printf("\n");
  return;
}

Assistant:

void Msat_ClausePrint( Msat_Clause_t * pC )
{
    int i;
    if ( pC == NULL )
        printf( "NULL pointer" );
    else 
    {
        if ( pC->fLearned )
            printf( "Act = %.4f  ", Msat_ClauseReadActivity(pC) );
        for ( i = 0; i < (int)pC->nSize; i++ )
            printf( " %s%d", ((pC->pData[i]&1)? "-": ""),  pC->pData[i]/2 + 1 );
    }
    printf( "\n" );
}